

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NIVS.cpp
# Opt level: O3

void __thiscall
OpenMD::RNEMD::NIVSMethod::NIVSMethod(NIVSMethod *this,SimInfo *info,ForceManager *forceMan)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  RNEMDFluxType RVar4;
  RNEMDParameters *pRVar5;
  double *pdVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  vector<double,_std::allocator<double>_> local_48;
  double local_30;
  
  RNEMD::RNEMD(&this->super_RNEMD,info,forceMan);
  (this->super_RNEMD)._vptr_RNEMD = (_func_int **)&PTR__RNEMD_0030a678;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_RNEMD).rnemdMethodLabel_,0,
             (char *)(this->super_RNEMD).rnemdMethodLabel_._M_string_length,0x29f35e);
  pRVar5 = info->simParams_->rnemdPars_;
  bVar2 = (pRVar5->KineticFlux).super_ParameterBase.empty_;
  bVar3 = (pRVar5->MomentumFlux).super_ParameterBase.empty_;
  RVar4 = (this->super_RNEMD).rnemdFluxType_;
  if (RVar4 < rnemdKePvector) {
    if ((7U >> (RVar4 & (rnemdKePvector|rnemdKePy)) & 1) == 0) {
      if ((0x38U >> (RVar4 & (rnemdKePvector|rnemdKePy)) & 1) == 0) {
        if ((0xc000U >> (RVar4 & (rnemdKePvector|rnemdKePy)) & 1) == 0) goto LAB_0026dff3;
        if (bVar2 != false || bVar3 != false) goto LAB_0026e02d;
      }
      else if (bVar3 != false) goto LAB_0026e02d;
      goto LAB_0026e067;
    }
    if (bVar2 != false) goto LAB_0026e02d;
LAB_0026e06f:
    dVar1 = (pRVar5->KineticFlux).data_;
    uVar7 = SUB84(dVar1,0);
    uVar8 = (undefined4)((ulong)dVar1 >> 0x20);
  }
  else {
LAB_0026dff3:
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method,\n\t\tNIVS\n\tcannot be used with the current flux type, %s\n"
             ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
LAB_0026e02d:
    snprintf(painCave.errMsg,2000,
             "RNEMD: The current method, NIVS, and flux type, %s,\n\tdid not have the correct flux value specified. Options\n\tinclude: kineticFlux and momentumFlux.\n"
             ,(this->super_RNEMD).rnemdFluxTypeLabel_._M_dataplus._M_p);
    painCave.isFatal = 1;
    painCave.severity = 1;
    simError();
LAB_0026e067:
    uVar7 = 0;
    uVar8 = 0;
    if (bVar2 == false) goto LAB_0026e06f;
  }
  RNEMD::setKineticFlux(&this->super_RNEMD,(RealType)CONCAT44(uVar8,uVar7));
  if (bVar3 != false) {
    return;
  }
  local_30 = (pRVar5->MomentumFlux).data_;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)operator_new(0x18);
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + 3;
  *local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 0.0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 0.0;
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 0.0;
  RVar4 = (this->super_RNEMD).rnemdFluxType_;
  pdVar6 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (RVar4 != rnemdPx) {
    if (RVar4 == rnemdPy) {
      pdVar6 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
    }
    else {
      if (RVar4 != rnemdPz) goto LAB_0026e0eb;
      pdVar6 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + 2;
    }
  }
  *pdVar6 = local_30;
LAB_0026e0eb:
  local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  RNEMD::setMomentumFluxVector(&this->super_RNEMD,&local_48);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

NIVSMethod::NIVSMethod(SimInfo* info, ForceManager* forceMan) :
      RNEMD {info, forceMan} {
    rnemdMethodLabel_ = "NIVS";

    RNEMDParameters* rnemdParams = info->getSimParams()->getRNEMDParameters();

    bool hasKineticFlux  = rnemdParams->haveKineticFlux();
    bool hasMomentumFlux = rnemdParams->haveMomentumFlux();

    bool methodFluxMismatch = false;
    bool hasCorrectFlux     = false;

    switch (rnemdFluxType_) {
    case rnemdKE:
    case rnemdRotKE:
    case rnemdFullKE:
      hasCorrectFlux = hasKineticFlux;
      break;
    case rnemdPx:
    case rnemdPy:
    case rnemdPz:
      hasCorrectFlux = hasMomentumFlux;
      break;
    case rnemdKePx:
    case rnemdKePy:
      hasCorrectFlux = hasMomentumFlux && hasKineticFlux;
      break;
    default:
      methodFluxMismatch = true;
      break;
    }

    if (methodFluxMismatch) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method,\n"
               "\t\tNIVS\n"
               "\tcannot be used with the current flux type, %s\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (!hasCorrectFlux) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "RNEMD: The current method, NIVS, and flux type, %s,\n"
               "\tdid not have the correct flux value specified. Options\n"
               "\tinclude: kineticFlux and momentumFlux.\n",
               rnemdFluxTypeLabel_.c_str());
      painCave.isFatal  = 1;
      painCave.severity = OPENMD_ERROR;
      simError();
    }

    if (hasKineticFlux) {
      setKineticFlux(rnemdParams->getKineticFlux());
    } else {
      setKineticFlux(0.0);
    }

    if (hasMomentumFlux) {
      RealType momentumFlux = rnemdParams->getMomentumFlux();
      std::vector<RealType> momentumFluxVector(3);

      switch (rnemdFluxType_) {
      case rnemdPx:
        momentumFluxVector[0] = momentumFlux;
        break;
      case rnemdPy:
        momentumFluxVector[1] = momentumFlux;
        break;
      case rnemdPz:
        momentumFluxVector[2] = momentumFlux;
        break;
      default:
        break;
      }

      setMomentumFluxVector(momentumFluxVector);
    }
  }